

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkGear.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChLinkGear::Get_shaft_pos1(ChVector<double> *__return_storage_ptr__,ChLinkGear *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ChFrame<double> absframe;
  ChVector<double> local_d8;
  ChQuaternion<double> local_c0;
  ChFrame<double> local_a0;
  
  dVar3 = DAT_011dd3e8;
  dVar1 = VNULL;
  dVar2 = DAT_011dd3e0;
  if ((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1 != (ChBodyFrame *)0x0) {
    local_d8.m_data[2] = 0.0;
    local_c0.m_data[0] = 1.0;
    local_c0.m_data[3] = 0.0;
    local_d8.m_data[0] = 0.0;
    local_d8.m_data[1] = 0.0;
    local_c0.m_data[1] = 0.0;
    local_c0.m_data[2] = 0.0;
    ChFrame<double>::ChFrame(&local_a0,&local_d8,&local_c0);
    ChFrame<double>::TransformLocalToParent
              ((ChFrame<double> *)(this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1,
               &this->local_shaft1,&local_a0);
    dVar3 = local_a0.coord.pos.m_data[2];
    dVar1 = local_a0.coord.pos.m_data[0];
    dVar2 = local_a0.coord.pos.m_data[1];
  }
  __return_storage_ptr__->m_data[0] = dVar1;
  __return_storage_ptr__->m_data[1] = dVar2;
  __return_storage_ptr__->m_data[2] = dVar3;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChLinkGear::Get_shaft_pos1() const {
    if (Body1) {
        ChFrame<double> absframe;
        ((ChFrame<double>*)Body1)->TransformLocalToParent(local_shaft1, absframe);
        return absframe.GetPos();
    } else
        return VNULL;
}